

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void FlushSnapshotToDisk(CCoinsViewCache *coins_cache,bool snapshot_loaded)

{
  long lVar1;
  string prefix;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  unsigned_long *in_R8;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff40;
  string in_stack_ffffffffffffff48;
  string local_98 [32];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer49;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"FlushSnapshotToDisk",(allocator<char> *)&stack0xffffffffffffff47);
  pcVar4 = "flushing coins cache";
  if (snapshot_loaded) {
    pcVar4 = "saving snapshot chainstate";
  }
  sVar2 = CCoinsViewCache::DynamicMemoryUsage(coins_cache);
  pcVar3 = (char *)(sVar2 / 1000000);
  tinyformat::format<char_const*,unsigned_long>
            ((string *)&stack0xffffffffffffff48,(tinyformat *)"%s (%.2f MB)",
             &stack0xffffffffffffff38,(char **)&stack0xffffffffffffff30,in_R8);
  prefix._M_string_length = (size_type)pcVar3;
  prefix._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff28;
  prefix.field_2._M_allocated_capacity = (size_type)pcVar4;
  prefix.field_2._8_8_ = in_stack_ffffffffffffff40;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
            (&logging_timer49,prefix,in_stack_ffffffffffffff48,(LogFlags)local_98,
             SUB81(&stack0xffffffffffffff48,0));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  std::__cxx11::string::~string(local_98);
  CCoinsViewCache::Flush(coins_cache);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer49);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void FlushSnapshotToDisk(CCoinsViewCache& coins_cache, bool snapshot_loaded)
{
    LOG_TIME_MILLIS_WITH_CATEGORY_MSG_ONCE(
        strprintf("%s (%.2f MB)",
                  snapshot_loaded ? "saving snapshot chainstate" : "flushing coins cache",
                  coins_cache.DynamicMemoryUsage() / (1000 * 1000)),
        BCLog::LogFlags::ALL);

    coins_cache.Flush();
}